

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void stbtt_GetPackedQuad(stbtt_packedchar *chardata,int pw,int ph,int char_index,float *xpos,
                        float *ypos,stbtt_aligned_quad *q,int align_to_integer)

{
  stbtt_packedchar *psVar1;
  float fVar2;
  float fVar3;
  float y;
  float x;
  stbtt_packedchar *b;
  float iph;
  float ipw;
  float *ypos_local;
  float *xpos_local;
  int char_index_local;
  int ph_local;
  int pw_local;
  stbtt_packedchar *chardata_local;
  
  psVar1 = chardata + char_index;
  if (align_to_integer == 0) {
    q->x0 = *xpos + psVar1->xoff;
    q->y0 = *ypos + psVar1->yoff;
    q->x1 = *xpos + psVar1->xoff2;
    q->y1 = *ypos + psVar1->yoff2;
  }
  else {
    fVar2 = ImFloorSigned(*xpos + psVar1->xoff + 0.5);
    fVar3 = ImFloorSigned(*ypos + psVar1->yoff + 0.5);
    q->x0 = (float)(int)fVar2;
    q->y0 = (float)(int)fVar3;
    q->x1 = ((float)(int)fVar2 + psVar1->xoff2) - psVar1->xoff;
    q->y1 = ((float)(int)fVar3 + psVar1->yoff2) - psVar1->yoff;
  }
  q->s0 = (float)psVar1->x0 * (1.0 / (float)pw);
  q->t0 = (float)psVar1->y0 * (1.0 / (float)ph);
  q->s1 = (float)psVar1->x1 * (1.0 / (float)pw);
  q->t1 = (float)psVar1->y1 * (1.0 / (float)ph);
  *xpos = psVar1->xadvance + *xpos;
  return;
}

Assistant:

STBTT_DEF void stbtt_GetPackedQuad(const stbtt_packedchar *chardata, int pw, int ph, int char_index, float *xpos, float *ypos, stbtt_aligned_quad *q, int align_to_integer)
{
   float ipw = 1.0f / pw, iph = 1.0f / ph;
   const stbtt_packedchar *b = chardata + char_index;

   if (align_to_integer) {
      float x = (float) STBTT_ifloor((*xpos + b->xoff) + 0.5f);
      float y = (float) STBTT_ifloor((*ypos + b->yoff) + 0.5f);
      q->x0 = x;
      q->y0 = y;
      q->x1 = x + b->xoff2 - b->xoff;
      q->y1 = y + b->yoff2 - b->yoff;
   } else {
      q->x0 = *xpos + b->xoff;
      q->y0 = *ypos + b->yoff;
      q->x1 = *xpos + b->xoff2;
      q->y1 = *ypos + b->yoff2;
   }

   q->s0 = b->x0 * ipw;
   q->t0 = b->y0 * iph;
   q->s1 = b->x1 * ipw;
   q->t1 = b->y1 * iph;

   *xpos += b->xadvance;
}